

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

void __thiscall ev3dev::led::flash(led *this,uint on_ms,uint off_ms)

{
  int iVar1;
  int in_ESI;
  int i;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  led *in_stack_ffffffffffffff68;
  int local_84;
  duration<long,std::ratio<1l,1000l>> local_80 [12];
  undefined4 local_74;
  string local_70 [95];
  allocator local_11 [5];
  int local_c;
  
  local_c = in_ESI;
  if (flash(unsigned_int,unsigned_int)::timer_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&flash(unsigned_int,unsigned_int)::timer_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)flash(unsigned_int,unsigned_int)::timer_abi_cxx11_,"timer",local_11);
      std::allocator<char>::~allocator((allocator<char> *)local_11);
      __cxa_atexit(std::__cxx11::string::~string,flash(unsigned_int,unsigned_int)::timer_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&flash(unsigned_int,unsigned_int)::timer_abi_cxx11_);
    }
  }
  std::__cxx11::string::string
            (local_70,(string *)flash(unsigned_int,unsigned_int)::timer_abi_cxx11_);
  set_trigger(in_stack_ffffffffffffff68,
              (string *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  ~led((led *)0x12b8a2);
  std::__cxx11::string::~string(local_70);
  if (local_c != 0) {
    local_74 = 0;
    local_84 = 100;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_80,&local_84);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_ffffffffffffff40);
    set_delay_on(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    ~led((led *)0x12b90e);
    set_delay_off(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    ~led((led *)0x12b930);
  }
  return;
}

Assistant:

void led::flash(unsigned on_ms, unsigned off_ms) {
    static const mode_type timer("timer");
    set_trigger(timer);
    if (on_ms) {
        // A workaround for ev3dev/ev3dev#225.
        // It takes some time for delay_{on,off} sysfs attributes to appear after
        // led trigger has been set to "timer".
        for (int i = 0; ; ++i) {
            std::this_thread::sleep_for(std::chrono::milliseconds(100));
            try {
                set_delay_on (on_ms );
                set_delay_off(off_ms);
                break;
            } catch(...) {
                if (i >= 5) throw;
            }
        }
    }
}